

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O1

void helics::helicsGetComplexVector
               (string_view val,
               vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *data)

{
  pointer *ppcVar1;
  char *pcVar2;
  char *__pos;
  value_t vVar3;
  iterator iVar4;
  pointer pcVar5;
  array_t *paVar6;
  double dVar7;
  string_view val_00;
  bool bVar8;
  bool bVar9;
  int iVar10;
  void *pvVar11;
  size_type sVar12;
  size_type sVar13;
  reference this;
  reference pvVar14;
  ulong uVar15;
  ulong uVar16;
  pointer extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  _Base_ptr in_XMM1_Qa;
  string_view input;
  string_view input_00;
  string_view val_01;
  string_view jsonString;
  string_view trimCharacters;
  string_view trimCharacters_00;
  double val2;
  basic_string_view<char,_std::char_traits<char>_> vstr1;
  double val1;
  basic_string_view<char,_std::char_traits<char>_> vstr2;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  complex<double> local_b8;
  int local_9c;
  iterator local_98;
  int local_74;
  data local_70;
  double local_60;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_58;
  double local_38;
  
  local_c8._M_str = val._M_str;
  local_c8._M_len = val._M_len;
  if ((char *)local_c8._M_len == (char *)0x0) {
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(data,0);
    return;
  }
  if (*local_c8._M_str == 'c') {
    iVar10 = readSize(val);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              (data,(long)iVar10);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(data,0);
    pcVar2 = local_c8._M_str;
    if ((char *)local_c8._M_len == (char *)0x0) {
      uVar15 = 0xffffffffffffffff;
    }
    else {
      pvVar11 = memchr(local_c8._M_str,0x5b,local_c8._M_len);
      uVar15 = -(ulong)(pvVar11 == (void *)0x0) | (long)pvVar11 - (long)pcVar2;
    }
    if (0 < iVar10) {
      do {
        pcVar2 = (char *)(uVar15 + 1);
        sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                           (&local_c8,",;]",(size_type)pcVar2,3);
        if (local_c8._M_len < pcVar2) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     pcVar2);
        }
        uVar16 = ~uVar15 + sVar12;
        if (local_c8._M_len - (long)pcVar2 < ~uVar15 + sVar12) {
          uVar16 = local_c8._M_len - (long)pcVar2;
        }
        val_01._M_str = pcVar2 + (long)local_c8._M_str;
        val_01._M_len = uVar16;
        helicsGetComplex(val_01);
        iVar4._M_current =
             (data->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (data->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
          _M_realloc_insert<std::complex<double>const&>
                    ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data,iVar4
                     ,(complex<double> *)&local_98);
        }
        else {
          *(undefined8 *)(iVar4._M_current)->_M_value = extraout_XMM0_Qa_00;
          *(_Base_ptr *)((iVar4._M_current)->_M_value + 8) = in_XMM1_Qa;
          ppcVar1 = &(data->
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        iVar10 = iVar10 + -1;
        uVar15 = sVar12;
      } while (iVar10 != 0);
    }
  }
  else if (*local_c8._M_str == 'v') {
    local_9c = readSize(val);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              (data,(long)(local_9c / 2));
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(data,0);
    pcVar2 = local_c8._M_str;
    if ((char *)local_c8._M_len == (char *)0x0) {
      uVar15 = 0xffffffffffffffff;
    }
    else {
      pvVar11 = memchr(local_c8._M_str,0x5b,local_c8._M_len);
      uVar15 = -(ulong)(pvVar11 == (void *)0x0) | (long)pvVar11 - (long)pcVar2;
    }
    if (1 < local_9c) {
      local_9c = local_9c + -1;
      local_74 = 0;
      do {
        __pos = (char *)(uVar15 + 1);
        sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                           (&local_c8,",;]",(size_type)__pos,3);
        pcVar2 = (char *)(sVar12 + 1);
        sVar13 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                           (&local_c8,",;]",(size_type)pcVar2,3);
        if (local_c8._M_len < __pos) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     __pos);
        }
        local_98.m_object = (pointer)(~uVar15 + sVar12);
        if ((utilities *)(local_c8._M_len + -(long)__pos) < (utilities *)(~uVar15 + sVar12)) {
          local_98.m_object = (pointer)(local_c8._M_len + -(long)__pos);
        }
        local_98.m_it.object_iterator._M_node = (_Base_ptr)(__pos + (long)local_c8._M_str);
        trimCharacters._M_str = (char *)local_c8._M_len;
        trimCharacters._M_len = (size_t)" \t\n\r";
        gmlc::utilities::string_viewOps::trimString
                  ((string_viewOps *)&local_98,(string_view *)0x4,trimCharacters);
        if (local_c8._M_len < pcVar2) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     pcVar2);
        }
        trimCharacters_00._M_str = (size_t *)~sVar12;
        local_58.m_object = (pointer)(sVar13 + (long)trimCharacters_00._M_str);
        if ((utilities *)(local_c8._M_len + -(long)pcVar2) <
            (utilities *)(sVar13 + (long)trimCharacters_00._M_str)) {
          local_58.m_object = (pointer)(local_c8._M_len + -(long)pcVar2);
        }
        local_58.m_it.object_iterator._M_node = (_Base_ptr)(pcVar2 + (long)local_c8._M_str);
        trimCharacters_00._M_len = (size_t)" \t\n\r";
        gmlc::utilities::string_viewOps::trimString
                  ((string_viewOps *)&local_58,(string_view *)0x4,trimCharacters_00);
        input._M_str = (char *)0x0;
        input._M_len = (size_t)local_98.m_it.object_iterator._M_node;
        local_70._0_8_ =
             gmlc::utilities::strViewToFloat<double>
                       ((utilities *)local_98.m_object,input,trimCharacters_00._M_str);
        input_00._M_str = (char *)0x0;
        input_00._M_len = (size_t)local_58.m_it.object_iterator._M_node;
        local_b8._M_value._0_8_ =
             gmlc::utilities::strViewToFloat<double>
                       ((utilities *)local_58.m_object,input_00,trimCharacters_00._M_str);
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double&,double&>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data,
                   (double *)&local_70,(double *)&local_b8);
        local_74 = local_74 + 2;
        uVar15 = sVar12;
      } while (local_74 < local_9c);
    }
  }
  else {
    sVar12 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                       (&local_c8,"ji",0,2);
    if (sVar12 == 0xffffffffffffffff) {
      jsonString._M_str = (char *)local_c8._M_len;
      jsonString._M_len = (size_t)&local_70;
      fileops::loadJsonStr_abi_cxx11_(jsonString);
      if (local_70.m_type - 5 < 3) {
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(data,0);
        local_98.m_object = (pointer)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_70,(double *)&local_98);
        local_58.m_object = local_98.m_object;
        local_98.m_object = (pointer)0x0;
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double,double>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data,
                   (double *)&local_58,(double *)&local_98);
      }
      else if ((utilities)local_70.m_type == (utilities)0x2) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::begin(&local_98,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)&local_70);
        local_58.m_it.primitive_iterator.m_it = -0x8000000000000000;
        local_58.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)0x0;
        local_58.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        if ((utilities)local_70.m_type == (utilities)0x2) {
          local_58.m_it.array_iterator._M_current =
               ((local_70.m_value.array)->
               super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
        }
        else if ((utilities)local_70.m_type == (utilities)0x1) {
          local_58.m_it.object_iterator._M_node =
               &((local_70.m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
        }
        else {
          local_58.m_it.primitive_iterator.m_it = 1;
        }
        bVar8 = false;
        local_58.m_object = (pointer)&local_70;
        while (bVar9 = nlohmann::json_abi_v3_11_3::detail::
                       iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                       ::
                       operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                 (&local_98,&local_58), !bVar9) {
          this = nlohmann::json_abi_v3_11_3::detail::
                 iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                 ::operator*(&local_98);
          vVar3 = (this->m_data).m_type;
          if ((byte)(vVar3 - number_integer) < 3) {
            if (bVar8) {
              local_b8._M_value._0_8_ = 0.0;
              nlohmann::json_abi_v3_11_3::detail::
              get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                        (this,(double *)&local_b8);
              pcVar5 = (data->
                       super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              dVar7 = *(double *)(pcVar5[-1]._M_value + 8);
              *(double *)pcVar5[-1]._M_value = *(double *)pcVar5[-1]._M_value + 0.0;
              *(double *)(pcVar5[-1]._M_value + 8) = dVar7 + (double)local_b8._M_value._0_8_;
LAB_00295d55:
              bVar8 = false;
            }
            else {
              local_b8._M_value._0_8_ = 0.0;
              nlohmann::json_abi_v3_11_3::detail::
              get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                        (this,(double *)&local_b8);
              local_60 = (double)local_b8._M_value._0_8_;
              local_b8._M_value._0_8_ = 0.0;
              std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
              emplace_back<double,double>
                        ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data,
                         &local_60,(double *)&local_b8);
              bVar8 = true;
            }
          }
          else if (vVar3 == array) {
            paVar6 = (this->m_data).m_value.array;
            if ((ulong)((long)(paVar6->
                              super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(paVar6->
                             super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) < 0x11) {
              paVar6 = (this->m_data).m_value.array;
              if ((long)(paVar6->
                        super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(paVar6->
                        super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4 != 1) {
                local_b8._M_value._0_8_ = -1e+49;
                local_b8._M_value._8_8_ = 0;
                iVar4._M_current =
                     (data->
                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar4._M_current ==
                    (data->
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
                  _M_realloc_insert<std::complex<double>>
                            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)
                             data,iVar4,&local_b8);
                }
                else {
                  *(undefined8 *)(iVar4._M_current)->_M_value = 0xca1b5e7e08ca3a8f;
                  *(undefined8 *)((iVar4._M_current)->_M_value + 8) = 0;
                  ppcVar1 = &(data->
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppcVar1 = *ppcVar1 + 1;
                }
                goto LAB_00295d55;
              }
              pvVar14 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator[](this,0);
              bVar8 = false;
              if ((byte)((pvVar14->m_data).m_type - number_integer) < 3) {
                pvVar14 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator[](this,0);
                local_b8._M_value._0_8_ = 0.0;
                nlohmann::json_abi_v3_11_3::detail::
                get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                          (pvVar14,(double *)&local_b8);
                local_60 = (double)local_b8._M_value._0_8_;
                local_b8._M_value._0_8_ = 0.0;
                std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
                emplace_back<double,double>
                          ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data
                           ,&local_60,(double *)&local_b8);
                bVar8 = false;
              }
            }
            else {
              pvVar14 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator[](this,0);
              bVar8 = false;
              if ((byte)((pvVar14->m_data).m_type - number_integer) < 3) {
                pvVar14 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator[](this,0);
                local_b8._M_value._0_8_ = 0.0;
                nlohmann::json_abi_v3_11_3::detail::
                get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                          (pvVar14,(double *)&local_b8);
                local_60 = (double)local_b8._M_value._0_8_;
                pvVar14 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::operator[](this,1);
                local_b8._M_value._0_8_ = 0.0;
                nlohmann::json_abi_v3_11_3::detail::
                get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                          (pvVar14,(double *)&local_b8);
                local_38 = (double)local_b8._M_value._0_8_;
                std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
                emplace_back<double,double>
                          ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data
                           ,&local_60,&local_38);
              }
            }
          }
          if (*(utilities *)local_98.m_object == (utilities)0x2) {
            local_98.m_it.array_iterator._M_current = local_98.m_it.array_iterator._M_current + 1;
          }
          else if (*(utilities *)local_98.m_object == (utilities)0x1) {
            local_98.m_it.object_iterator._M_node =
                 (_Base_ptr)std::_Rb_tree_increment(local_98.m_it.object_iterator._M_node);
          }
          else {
            local_98.m_it.primitive_iterator.m_it = local_98.m_it.primitive_iterator.m_it + 1;
          }
        }
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_70);
    }
    else {
      val_00._M_str = local_c8._M_str;
      val_00._M_len = local_c8._M_len;
      helicsGetComplex(val_00);
      local_98.m_object = extraout_XMM0_Qa;
      local_98.m_it.object_iterator._M_node = in_XMM1_Qa;
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(data,0);
      iVar4._M_current =
           (data->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (data->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        _M_realloc_insert<std::complex<double>const&>
                  ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)data,iVar4,
                   (complex<double> *)&local_98);
      }
      else {
        *(pointer *)(iVar4._M_current)->_M_value = local_98.m_object;
        *(_Base_ptr *)((iVar4._M_current)->_M_value + 8) = local_98.m_it.object_iterator._M_node;
        ppcVar1 = &(data->
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void helicsGetComplexVector(std::string_view val, std::vector<std::complex<double>>& data)
{
    if (val.empty()) {
        data.resize(0);
        return;
    }
    if (val.front() == 'v') {
        auto size = readSize(val);
        data.reserve(size / 2);
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size - 1; ii += 2) {
            auto nextChar = val.find_first_of(",;]", firstBracket + 1);
            auto secondChar = val.find_first_of(",;]", nextChar + 1);
            try {
                auto vstr1 = val.substr(firstBracket + 1, nextChar - firstBracket - 1);
                string_viewOps::trimString(vstr1);
                auto vstr2 = val.substr(nextChar + 1, secondChar - nextChar - 1);
                string_viewOps::trimString(vstr2);
                auto val1 = numConv<double>(vstr1);
                auto val2 = numConv<double>(vstr2);
                data.emplace_back(val1, val2);
            }
            catch (const std::invalid_argument&) {
                data.push_back(invalidValue<std::complex<double>>());
            }
            firstBracket = nextChar;
        }
    } else if (val.front() == 'c') {
        auto size = readSize(val);
        data.reserve(size);
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size; ++ii) {
            auto nextChar = val.find_first_of(",;]", firstBracket + 1);
            auto cval = helicsGetComplex(val.substr(firstBracket + 1, nextChar - firstBracket - 1));
            data.push_back(cval);
            firstBracket = nextChar;
        }
    } else {
        if (val.find_first_of("ji") != std::string_view::npos) {
            auto cval = helicsGetComplex(val);
            data.resize(0);
            data.push_back(cval);
        } else {
            auto json = fileops::loadJsonStr(val);
            int cnt{0};
            switch (json.type()) {
                case nlohmann::json::value_t::number_float:
                case nlohmann::json::value_t::number_integer:
                case nlohmann::json::value_t::number_unsigned:
                    data.resize(0);
                    data.emplace_back(json.get<double>(), 0.0);
                    break;
                case nlohmann::json::value_t::array:
                    for (auto& aval : json) {
                        if (aval.is_number()) {
                            if (cnt == 0) {
                                data.emplace_back(aval.get<double>(), 0.0);
                                cnt = 1;
                            } else {
                                data.back() += std::complex<double>{0.0, aval.get<double>()};
                                cnt = 0;
                            }
                        } else if (aval.is_array()) {
                            cnt = 0;
                            if (aval.size() >= 2) {
                                if (aval[0].is_number()) {
                                    data.emplace_back(aval[0].get<double>(), aval[1].get<double>());
                                }
                            } else if (aval.size() == 1) {
                                if (aval[0].is_number()) {
                                    data.emplace_back(aval[0].get<double>(), 0.0);
                                }
                            } else {
                                data.push_back(invalidValue<std::complex<double>>());
                            }
                        }
                    }
                    break;
                default:
                    break;
            }
        }
    }
}